

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O2

size_t absl::lts_20240722::cord_internal::GetEstimatedFairShareMemoryUsage
                 (Nonnull<const_CordRep_*> rep)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  CordRepCrc *pCVar4;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> rep_00;
  CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> rep_01;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> raw_usage;
  undefined1 local_18 [16];
  
  local_18._0_8_ = 0.0;
  iVar1 = (rep->refcount).count_.super___atomic_base<int>._M_i;
  iVar3 = iVar1 >> 1;
  auVar5._8_4_ = iVar1 >> 0x1f;
  auVar5._0_8_ = (long)iVar3;
  auVar5._12_4_ = 0x45300000;
  local_18._8_8_ =
       1.0 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0));
  if (rep->tag == '\x02') {
    local_18._0_8_ = (double)local_18._8_8_ * 32.0 + 0.0;
    pCVar4 = CordRep::crc(rep);
    if (pCVar4->child == (CordRep *)0x0) goto LAB_00118f28;
    pCVar4 = CordRep::crc(rep);
    rep = pCVar4->child;
    iVar1 = (rep->refcount).count_.super___atomic_base<int>._M_i;
    iVar3 = iVar1 >> 1;
    auVar6._8_4_ = iVar1 >> 0x1f;
    auVar6._0_8_ = (long)iVar3;
    auVar6._12_4_ = 0x45300000;
    local_18._8_8_ =
         (double)local_18._8_8_ /
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0));
  }
  bVar2 = IsDataEdge(rep);
  if (bVar2) {
    rep_00.fraction = (double)local_18._8_8_;
    rep_00.rep = (Nonnull<const_CordRep_*>)local_18;
    anon_unknown_0::
    AnalyzeDataEdge<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0>
              ((anon_unknown_0 *)rep,rep_00,raw_usage_00);
  }
  else {
    if (rep->tag != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord_analysis.cc"
                    ,0xae,
                    "size_t absl::cord_internal::(anonymous namespace)::GetEstimatedUsage(absl::Nonnull<const CordRep *>) [mode = absl::cord_internal::(anonymous namespace)::Mode::kFairShare]"
                   );
    }
    rep_01.fraction = (double)local_18._8_8_;
    rep_01.rep = (Nonnull<const_CordRep_*>)local_18;
    anon_unknown_0::AnalyzeBtree<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0>
              ((anon_unknown_0 *)rep,rep_01,raw_usage_00);
  }
LAB_00118f28:
  return (long)((double)local_18._0_8_ - 9.223372036854776e+18) &
         (long)(double)local_18._0_8_ >> 0x3f | (long)(double)local_18._0_8_;
}

Assistant:

size_t GetEstimatedFairShareMemoryUsage(absl::Nonnull<const CordRep*> rep) {
  return GetEstimatedUsage<Mode::kFairShare>(rep);
}